

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O2

void lj_err_optype(lua_State *L,cTValue *o,ErrMsg opm)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  char *pcVar4;
  char *oname;
  
  uVar3 = 0xd;
  if (0xfffffffffffffff2 < (ulong)(o->it64 >> 0x2f)) {
    uVar3 = ~(o->it64 >> 0x2f);
  }
  pcVar1 = lj_obj_itypename[uVar3];
  uVar3 = L->base[-2].u64 & 0x7fffffffffff;
  pcVar4 = lj_err_allmsg + (int)opm;
  if (*(char *)(uVar3 + 10) == '\0') {
    oname = (char *)0x0;
    pcVar2 = lj_debug_slotname((GCproto *)(*(long *)(uVar3 + 0x20) + -0x68),
                               (BCIns *)(*(long *)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x18) +
                                        -4),(BCReg)((ulong)((long)o - (long)L->base) >> 3),&oname);
    if (pcVar2 != (char *)0x0) {
      err_msgv(L,LJ_ERR_BADOPRT,pcVar4,pcVar2,oname,pcVar1);
    }
  }
  err_msgv(L,LJ_ERR_BADOPRV,pcVar4,pcVar1);
}

Assistant:

LJ_NOINLINE void lj_err_optype(lua_State *L, cTValue *o, ErrMsg opm)
{
  const char *tname = lj_typename(o);
  const char *opname = err2msg(opm);
  if (curr_funcisL(L)) {
    GCproto *pt = curr_proto(L);
    const BCIns *pc = cframe_Lpc(L) - 1;
    const char *oname = NULL;
    const char *kind = lj_debug_slotname(pt, pc, (BCReg)(o-L->base), &oname);
    if (kind)
      err_msgv(L, LJ_ERR_BADOPRT, opname, kind, oname, tname);
  }
  err_msgv(L, LJ_ERR_BADOPRV, opname, tname);
}